

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O0

void Llb_ManGroupCreate_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Ptr_t *vSupp)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *vSupp_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(pAig,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(pAig,pObj);
    iVar1 = Aig_ObjIsConst1(pObj);
    if (iVar1 == 0) {
      if ((*(ulong *)&pObj->field_0x18 >> 4 & 1) == 0) {
        iVar1 = Aig_ObjIsAnd(pObj);
        if (iVar1 == 0) {
          __assert_fail("Aig_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Group.c"
                        ,0x9f,"void Llb_ManGroupCreate_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
        }
        pAVar2 = Aig_ObjFanin0(pObj);
        Llb_ManGroupCreate_rec(pAig,pAVar2,vSupp);
        pAVar2 = Aig_ObjFanin1(pObj);
        Llb_ManGroupCreate_rec(pAig,pAVar2,vSupp);
      }
      else {
        Vec_PtrPush(vSupp,pObj);
      }
    }
  }
  return;
}

Assistant:

void Llb_ManGroupCreate_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Ptr_t * vSupp )
{ 
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsConst1(pObj) )
        return;
    if ( pObj->fMarkA )
    {
        Vec_PtrPush( vSupp, pObj );
        return;
    }
    assert( Aig_ObjIsAnd(pObj) );
    Llb_ManGroupCreate_rec( pAig, Aig_ObjFanin0(pObj), vSupp );
    Llb_ManGroupCreate_rec( pAig, Aig_ObjFanin1(pObj), vSupp );
}